

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_dpll_triad_simd.cc
# Opt level: O0

bool anon_unknown.dwarf_12932::SolverDpllTriadSimd<0>::BandEliminate<0>
               (State *state,int band_idx,int from_peer)

{
  bool bVar1;
  Bitvec08x16 *this;
  int in_ESI;
  long in_RDI;
  int extraout_XMM0_Dd;
  Cells08 *triads_00;
  Cells08 peer_triads [3];
  int (*box_peers) [3];
  int peer [3];
  Cells08 hi;
  Cells08 lo;
  Cells16 asserting;
  Cells16 counts;
  Cells16 triads;
  Band *band;
  undefined4 in_stack_fffffffffffffce0;
  undefined4 in_stack_fffffffffffffce4;
  Bitvec16x16 *in_stack_fffffffffffffce8;
  undefined4 in_stack_fffffffffffffcf0;
  undefined2 in_stack_fffffffffffffcf4;
  uint16_t in_stack_fffffffffffffcf6;
  bool local_2e1;
  Cells08 *in_stack_fffffffffffffd30;
  undefined8 in_stack_fffffffffffffd68;
  int iVar2;
  Cells08 *in_stack_fffffffffffffd70;
  Cells16 *in_stack_fffffffffffffe08;
  int in_stack_fffffffffffffe14;
  State *in_stack_fffffffffffffe18;
  longlong local_1a0;
  longlong local_198;
  longlong local_130;
  longlong local_128;
  longlong local_60;
  longlong local_58;
  bool local_31;
  
  iVar2 = (int)((ulong)in_stack_fffffffffffffd68 >> 0x20);
  this = (Bitvec08x16 *)(in_RDI + (long)in_ESI * 0x20);
  bVar1 = Bitvec08x16::Intersects(this,this + 1);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    Bitvec08x16::and_not
              ((Bitvec08x16 *)in_stack_fffffffffffffce8,
               (Bitvec08x16 *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
    this->vec[0] = local_60;
    this->vec[1] = local_58;
    ConfigurationsToPositiveTriads(in_stack_fffffffffffffd30);
    Bitvec16x16::Popcounts9
              ((Bitvec16x16 *)
               CONCAT26(in_stack_fffffffffffffcf6,
                        CONCAT24(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0)));
    Bitvec16x16::All(in_stack_fffffffffffffcf6);
    Bitvec16x16::WhichEqual
              ((Bitvec16x16 *)
               CONCAT26(in_stack_fffffffffffffcf6,
                        CONCAT24(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0)),
               in_stack_fffffffffffffce8);
    Bitvec16x16::operator&
              ((Bitvec16x16 *)
               CONCAT26(in_stack_fffffffffffffcf6,
                        CONCAT24(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0)),
               in_stack_fffffffffffffce8);
    Bitvec16x16::GetLo((Bitvec16x16 *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0))
    ;
    Bitvec16x16::GetHi((Bitvec16x16 *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0))
    ;
    Bitvec08x16::RotateCols
              ((Bitvec08x16 *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
    Bitvec08x16::Shuffle
              ((Bitvec08x16 *)in_stack_fffffffffffffce8,
               (Bitvec08x16 *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
    Bitvec08x16::RotateCols
              ((Bitvec08x16 *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
    Bitvec08x16::Shuffle
              ((Bitvec08x16 *)in_stack_fffffffffffffce8,
               (Bitvec08x16 *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
    Bitvec08x16::Shuffle
              ((Bitvec08x16 *)in_stack_fffffffffffffce8,
               (Bitvec08x16 *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
    Bitvec08x16::X_Y_or_Z_or
              ((Bitvec08x16 *)
               CONCAT26(in_stack_fffffffffffffcf6,
                        CONCAT24(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0)),
               (Bitvec08x16 *)in_stack_fffffffffffffce8,
               (Bitvec08x16 *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
    Bitvec08x16::and_not
              ((Bitvec08x16 *)in_stack_fffffffffffffce8,
               (Bitvec08x16 *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
    this->vec[0] = local_130;
    this->vec[1] = local_128;
    Bitvec08x16::Shuffle
              ((Bitvec08x16 *)in_stack_fffffffffffffce8,
               (Bitvec08x16 *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
    Bitvec08x16::RotateCols
              ((Bitvec08x16 *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
    Bitvec08x16::Shuffle
              ((Bitvec08x16 *)in_stack_fffffffffffffce8,
               (Bitvec08x16 *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
    Bitvec08x16::RotateCols
              ((Bitvec08x16 *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
    Bitvec08x16::Shuffle
              ((Bitvec08x16 *)in_stack_fffffffffffffce8,
               (Bitvec08x16 *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
    Bitvec08x16::X_Y_or_Z_or
              ((Bitvec08x16 *)
               CONCAT26(in_stack_fffffffffffffcf6,
                        CONCAT24(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0)),
               (Bitvec08x16 *)in_stack_fffffffffffffce8,
               (Bitvec08x16 *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
    Bitvec08x16::and_not
              ((Bitvec08x16 *)in_stack_fffffffffffffce8,
               (Bitvec08x16 *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
    this->vec[0] = local_1a0;
    this->vec[1] = local_198;
    ConfigurationsToPositiveTriads(in_stack_fffffffffffffd30);
    triads_00 = (Cells08 *)0x0;
    Bitvec16x16::GetLo((Bitvec16x16 *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0))
    ;
    Bitvec16x16::GetLo((Bitvec16x16 *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0))
    ;
    Bitvec08x16::RotateCols
              ((Bitvec08x16 *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
    Bitvec16x16::GetHi((Bitvec16x16 *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0))
    ;
    PositiveTriadsToBoxCandidates(in_stack_fffffffffffffd70,iVar2);
    iVar2 = extraout_XMM0_Dd;
    bVar1 = BoxRestrict<0>(in_stack_fffffffffffffe18,in_stack_fffffffffffffe14,
                           in_stack_fffffffffffffe08);
    local_2e1 = false;
    if (bVar1) {
      PositiveTriadsToBoxCandidates(triads_00,iVar2);
      bVar1 = BoxRestrict<0>(in_stack_fffffffffffffe18,in_stack_fffffffffffffe14,
                             in_stack_fffffffffffffe08);
      local_2e1 = false;
      if (bVar1) {
        PositiveTriadsToBoxCandidates(triads_00,iVar2);
        local_2e1 = BoxRestrict<0>(in_stack_fffffffffffffe18,in_stack_fffffffffffffe14,
                                   in_stack_fffffffffffffe08);
      }
    }
    local_31 = local_2e1;
  }
  else {
    local_31 = true;
  }
  return local_31;
}

Assistant:

static bool BandEliminate(State &state, int band_idx, int from_peer = 0) {
        Band &band = state.bands[vertical][band_idx];
        if (LIKELY(!band.configurations.Intersects(band.eliminations))) return true;
        // after eliminating we might check that every value is still consistent with some
        // configuration, but the check is a net loss.
        band.configurations = band.configurations.and_not(band.eliminations);

        Cells16 triads = ConfigurationsToPositiveTriads(band.configurations);
        // we might check here that every cell (corresponding to a minirow or minicol) still has
        // at least three triad candidates, but the check is a net loss.
        Cells16 counts = triads.Popcounts9();

        // we might repeat the updating of triads below until we no longer trigger new triad 3/
        // clauses. however, just once delivers most of the benefit, and it's best not to branch.
        Cells16 asserting = triads & counts.WhichEqual(Cells16::All(3));
        Cells08 lo = asserting.GetLo();
        Cells08 hi = asserting.GetHi();
        band.configurations = band.configurations.and_not(Cells08::X_Y_or_Z_or(
                lo.RotateCols().Shuffle(tables.triads_shift1_to_config_elims[0]),
                lo.RotateCols().Shuffle(tables.triads_shift2_to_config_elims[0]),
                lo.Shuffle(tables.triads_shift1_to_config_elims[1])));
        band.configurations = band.configurations.and_not(Cells08::X_Y_or_Z_or(
                lo.Shuffle(tables.triads_shift2_to_config_elims[1]),
                hi.RotateCols().Shuffle(tables.triads_shift1_to_config_elims[2]),
                hi.RotateCols().Shuffle(tables.triads_shift2_to_config_elims[2])));
        triads = ConfigurationsToPositiveTriads(band.configurations);

        // convert positive triads to box restriction messages and send to the three box peers.
        // send these messages in order so that we return to the inbound peer last.
        int peer[3]{tables.mod3[from_peer + 1], tables.mod3[from_peer + 2], from_peer};
        auto &box_peers = tables.box_peers[vertical][band_idx];
        Cells08 peer_triads[3]{ triads.GetLo(), triads.GetLo().RotateCols(), triads.GetHi() };
        return (BoxRestrict<vertical>(state, box_peers[peer[0]],
                        PositiveTriadsToBoxCandidates(peer_triads[peer[0]], vertical)) &&
                BoxRestrict<vertical>(state, box_peers[peer[1]],
                        PositiveTriadsToBoxCandidates(peer_triads[peer[1]], vertical)) &&
                BoxRestrict<vertical>(state, box_peers[peer[2]],
                        PositiveTriadsToBoxCandidates(peer_triads[peer[2]], vertical)));
    }